

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O1

void __thiscall GlobalMemoryAccountant::stop(GlobalMemoryAccountant *this)

{
  UtestShell *pUVar1;
  TestTerminatorWithoutExceptions local_10;
  
  if (this->mallocAllocator_ == (AccountingTestMemoryAllocator *)0x0) {
    pUVar1 = UtestShell::getCurrent();
    local_10.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_0016c8c0;
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,"GlobalMemoryAccount: Stop called without starting",
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x2f7);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_10);
  }
  if (currentMallocAllocator == (TestMemoryAllocator *)0x0) {
    defaultMallocAllocator();
    currentMallocAllocator = &defaultMallocAllocator::allocator;
  }
  if ((AccountingTestMemoryAllocator *)currentMallocAllocator != this->mallocAllocator_) {
    pUVar1 = UtestShell::getCurrent();
    local_10.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_0016c8c0;
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,
               "GlobalMemoryAccountant: Malloc memory allocator has been changed while accounting for memory"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x2fa);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_10);
  }
  if (currentNewAllocator == (TestMemoryAllocator *)0x0) {
    defaultNewAllocator();
    currentNewAllocator = &defaultNewAllocator::allocator;
  }
  if ((AccountingTestMemoryAllocator *)currentNewAllocator != this->newAllocator_) {
    pUVar1 = UtestShell::getCurrent();
    local_10.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_0016c8c0;
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,
               "GlobalMemoryAccountant: New memory allocator has been changed while accounting for memory"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x2fd);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_10);
  }
  if (currentNewArrayAllocator == (TestMemoryAllocator *)0x0) {
    defaultNewArrayAllocator();
    currentNewArrayAllocator = &defaultNewArrayAllocator::allocator;
  }
  if ((AccountingTestMemoryAllocator *)currentNewArrayAllocator != this->newArrayAllocator_) {
    pUVar1 = UtestShell::getCurrent();
    local_10.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_0016c8c0;
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,
               "GlobalMemoryAccountant: New Array memory allocator has been changed while accounting for memory"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x300);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_10);
  }
  restoreMemoryAllocators(this);
  return;
}

Assistant:

void GlobalMemoryAccountant::stop()
{
    if (mallocAllocator_ == NULLPTR)
      FAIL("GlobalMemoryAccount: Stop called without starting");

    if (getCurrentMallocAllocator() != mallocAllocator_)
        FAIL("GlobalMemoryAccountant: Malloc memory allocator has been changed while accounting for memory");

    if (getCurrentNewAllocator() != newAllocator_)
        FAIL("GlobalMemoryAccountant: New memory allocator has been changed while accounting for memory");

    if (getCurrentNewArrayAllocator() != newArrayAllocator_)
        FAIL("GlobalMemoryAccountant: New Array memory allocator has been changed while accounting for memory");

    restoreMemoryAllocators();
}